

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uuid.cpp
# Opt level: O3

void __thiscall pstore::uuid::uuid(uuid *this,string *str)

{
  undefined8 uVar1;
  uuid *puVar2;
  maybe<pstore::uuid,_void> d;
  maybe<pstore::uuid,_void> local_21;
  
  (this->data_)._M_elems[0] = '\0';
  (this->data_)._M_elems[1] = '\0';
  (this->data_)._M_elems[2] = '\0';
  (this->data_)._M_elems[3] = '\0';
  (this->data_)._M_elems[4] = '\0';
  (this->data_)._M_elems[5] = '\0';
  (this->data_)._M_elems[6] = '\0';
  (this->data_)._M_elems[7] = '\0';
  (this->data_)._M_elems[8] = '\0';
  (this->data_)._M_elems[9] = '\0';
  (this->data_)._M_elems[10] = '\0';
  (this->data_)._M_elems[0xb] = '\0';
  (this->data_)._M_elems[0xc] = '\0';
  (this->data_)._M_elems[0xd] = '\0';
  (this->data_)._M_elems[0xe] = '\0';
  (this->data_)._M_elems[0xf] = '\0';
  from_string(&local_21,str);
  if (local_21.valid_ != false) {
    puVar2 = maybe<pstore::uuid,_void>::operator->(&local_21);
    uVar1 = *(undefined8 *)((puVar2->data_)._M_elems + 8);
    *(undefined8 *)(this->data_)._M_elems = *(undefined8 *)(puVar2->data_)._M_elems;
    *(undefined8 *)((this->data_)._M_elems + 8) = uVar1;
    return;
  }
  raise<pstore::error_code>(uuid_parse_error);
}

Assistant:

uuid::uuid (std::string const & str) {
        maybe<uuid> d = uuid::from_string (str);
        if (!d.has_value ()) {
            raise (pstore::error_code::uuid_parse_error);
        }
        data_ = d->array ();
    }